

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void x_convolve_2tap_16x2_avx2(uint8_t *src,ptrdiff_t stride,__m256i *coeffs,__m256i *r)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 (*in_RCX) [32];
  ptrdiff_t in_RDX;
  ptrdiff_t strideInByte;
  void *in_RSI;
  __m256i *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 uVar4;
  undefined8 in_XMM0_Qb;
  undefined8 uVar6;
  undefined8 in_YMM0_H;
  undefined8 uVar7;
  undefined8 in_register_00001218;
  undefined8 uVar8;
  undefined1 auVar5 [32];
  __m256i s1;
  __m256i s0;
  __m256i s1_256;
  __m256i s0_256;
  __m256i *coeffs_00;
  __m256i *ss;
  
  loadu_8bit_16x2_avx2(in_RDI,in_RSI,in_RDX);
  uVar4 = in_XMM0_Qa;
  uVar6 = in_XMM0_Qb;
  uVar7 = in_YMM0_H;
  uVar8 = in_register_00001218;
  loadu_8bit_16x2_avx2((__m256i *)((long)*in_RDI + 1),in_RSI,strideInByte);
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = in_XMM0_Qa;
  auVar1._16_8_ = in_YMM0_H;
  auVar1._24_8_ = in_register_00001218;
  auVar5._8_8_ = uVar6;
  auVar5._0_8_ = uVar4;
  auVar5._16_8_ = uVar7;
  auVar5._24_8_ = uVar8;
  vpunpcklbw_avx2(auVar1,auVar5);
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = in_XMM0_Qa;
  auVar3._16_8_ = in_YMM0_H;
  auVar3._24_8_ = in_register_00001218;
  auVar2._8_8_ = uVar6;
  auVar2._0_8_ = uVar4;
  auVar2._16_8_ = uVar7;
  auVar2._24_8_ = uVar8;
  auVar5 = vpunpckhbw_avx2(auVar3,auVar2);
  ss = auVar5._16_8_;
  coeffs_00 = auVar5._8_8_;
  convolve_2tap_avx2(ss,coeffs_00);
  *in_RCX = auVar5;
  convolve_2tap_avx2(ss,coeffs_00);
  in_RCX[1] = auVar5;
  return;
}

Assistant:

static inline void x_convolve_2tap_16x2_avx2(const uint8_t *const src,
                                             const ptrdiff_t stride,
                                             const __m256i coeffs[1],
                                             __m256i r[2]) {
  const __m256i s0_256 = loadu_8bit_16x2_avx2(src, stride);
  const __m256i s1_256 = loadu_8bit_16x2_avx2(src + 1, stride);
  const __m256i s0 = _mm256_unpacklo_epi8(s0_256, s1_256);
  const __m256i s1 = _mm256_unpackhi_epi8(s0_256, s1_256);
  r[0] = convolve_2tap_avx2(&s0, coeffs);
  r[1] = convolve_2tap_avx2(&s1, coeffs);
}